

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>,void>
               (vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                *container,ostream *os)

{
  pointer pEVar1;
  pointer pEVar2;
  long lVar3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  pEVar2 = (container->
           super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (container->
           super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar2 != pEVar1) {
    lVar4 = 0;
    do {
      lVar3 = lVar4 + -1;
      if ((lVar4 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar4 == -0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_0012efe5;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      pEVar2 = pEVar2 + 1;
      lVar4 = lVar3;
    } while (pEVar2 != pEVar1);
    if (lVar3 != 0) {
LAB_0012efe5:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }